

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_compute_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  StateCreatorInterface *pSVar1;
  undefined8 uVar2;
  bool bVar3;
  SizeType SVar4;
  int iVar5;
  Ch *pCVar6;
  const_iterator cVar7;
  undefined8 *puVar8;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar9;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  Number NVar10;
  ulonglong uVar11;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> _Var12;
  void *__dest;
  mapped_type *ppVVar13;
  ulong __n;
  uint64_t module;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  Hash hash;
  allocator_type local_79;
  ulonglong local_78;
  StateCreatorInterface *local_70;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_68;
  size_type local_60;
  Data local_58;
  long local_48;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  ulonglong local_38;
  
  local_70 = iface;
  pCVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(member);
  local_38 = strtoull(pCVar6,(char **)0x0,0x10);
  local_40 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->replayed_compute_pipelines;
  cVar7 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_40,&local_38);
  if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>._M_cur
      != (__node_type *)0x0) {
    return true;
  }
  puVar8 = (undefined8 *)ScratchAllocator::allocate_raw(&this->allocator,0x60,0x10);
  if (puVar8 != (undefined8 *)0x0) {
    puVar8[10] = 0;
    puVar8[0xb] = 0;
    puVar8[8] = 0;
    puVar8[9] = 0;
    puVar8[6] = 0;
    puVar8[7] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    *puVar8 = 0;
    puVar8[1] = 0;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pipelines,member);
  *(undefined4 *)puVar8 = 0x1d;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"flags");
  pSVar1 = local_70;
  if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_00148df5:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar8 + 2) = (pGVar9->data_).s.length;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"basePipelineIndex");
  if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    __assert_fail("data_.f.flags & kIntFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x718,
                  "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar8 + 0xb) = (pGVar9->data_).s.length;
  *(uint *)(puVar8 + 2) = *(uint *)(puVar8 + 2) & 0x7ffffc3f;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"basePipelineHandle");
  bVar3 = parse_derived_pipeline_handle
                    (this,pSVar1,resolver,pGVar9,pipelines,RESOURCE_COMPUTE_PIPELINE,
                     (VkPipeline *)(puVar8 + 10));
  if (!bVar3) {
    return false;
  }
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"layout");
  bVar3 = parse_pipeline_layout_handle(this,pGVar9,(VkPipelineLayout *)(puVar8 + 9));
  if (!bVar3) {
    return false;
  }
  this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"stage");
  *(undefined4 *)(puVar8 + 3) = 0x12;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"stage");
  if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) goto LAB_00148df5;
  *(SizeType *)((long)puVar8 + 0x2c) = (pGVar9->data_).s.length;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) goto LAB_00148df5;
  *(SizeType *)(puVar8 + 5) = (pGVar9->data_).s.length;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)this_01);
  uVar2 = local_58.n;
  NVar10.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01);
  if (uVar2 != NVar10.i64) {
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"pNext");
    bVar3 = parse_pnext_chain(this,pGVar9,(void **)(puVar8 + 4),(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar3) {
      return false;
    }
  }
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"module");
  pCVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar9);
  uVar11 = strtoull(pCVar6,(char **)0x0,0x10);
  local_78 = uVar11;
  if ((uVar11 == 0) || (this->resolve_shader_modules != true)) goto LAB_00148b92;
  local_68 = this_01;
  _Var12._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&(this->replayed_shader_modules)._M_h,&local_78);
  if (_Var12._M_cur == (__node_type *)0x0) {
    local_60 = 0;
    if ((resolver == (DatabaseInterface *)0x0) ||
       (iVar5 = (*resolver->_vptr_DatabaseInterface[3])(resolver,4,local_78,&local_60,0),
       (char)iVar5 == '\0')) {
      log_missing_resource("Shader module",local_78);
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58.s,local_60,
               &local_79);
    iVar5 = (*resolver->_vptr_DatabaseInterface[3])(resolver,4,local_78,&local_60,local_58.n.i64);
    pSVar1 = local_70;
    if ((char)iVar5 != '\0') {
      bVar3 = parse(this,local_70,resolver,(void *)local_58.n,(long)local_58.s.str - local_58._0_8_)
      ;
      if (!bVar3) goto LAB_00148ddc;
      (*pSVar1->_vptr_StateCreatorInterface[0xf])(pSVar1);
      _Var12._M_cur =
           (__node_type *)
           std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->replayed_shader_modules)._M_h,&local_78);
      if (_Var12._M_cur != (__node_type *)0x0) {
        if (local_58.n.i64 != 0) {
          operator_delete((void *)local_58.n,local_48 - local_58._0_8_);
        }
        goto LAB_00148b89;
      }
    }
    log_missing_resource("Shader module",local_78);
LAB_00148ddc:
    if (local_58.n.i64 != 0) {
      operator_delete((void *)local_58.n,local_48 - local_58._0_8_);
    }
    return false;
  }
  (*local_70->_vptr_StateCreatorInterface[0xf])();
LAB_00148b89:
  uVar11 = *(ulonglong *)
            ((long)&((_Var12._M_cur)->
                    super__Hash_node_value<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>
                    ._M_storage._M_storage + 8);
  this_01 = local_68;
LAB_00148b92:
  puVar8[6] = uVar11;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"name");
  local_68 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetString(pGVar9);
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"name");
  SVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(pGVar9);
  __n = (ulong)SVar4;
  __dest = ScratchAllocator::allocate_raw(&this->allocator,__n + 1,0x10);
  memcpy(__dest,local_68,__n);
  *(undefined1 *)((long)__dest + __n) = 0;
  puVar8[7] = __dest;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)this_01);
  uVar2 = local_58.n;
  NVar10.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01);
  if (uVar2 != NVar10.i64) {
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"specializationInfo");
    parse_specialization_info(this,pGVar9,(VkSpecializationInfo **)(puVar8 + 8));
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)this_00);
  NVar10.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00);
  if (local_58.n.i64 != (Number)NVar10.i64) {
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"pNext");
    bVar3 = parse_pnext_chain(this,pGVar9,(void **)(puVar8 + 1),(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar3) {
      return false;
    }
  }
  uVar11 = local_38;
  ppVVar13 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_40,&local_38);
  iVar5 = (*local_70->_vptr_StateCreatorInterface[0xb])(local_70,uVar11,puVar8,ppVVar13);
  return (bool)(char)iVar5;
}

Assistant:

bool StateReplayer::Impl::parse_compute_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                 const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_compute_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkComputePipelineCreateInfo>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_COMPUTE_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	auto &stage = obj["stage"];
	info.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	info.stage.stage = static_cast<VkShaderStageFlagBits>(stage["stage"].GetUint());
	info.stage.flags = stage["flags"].GetUint();

	if (stage.HasMember("pNext"))
		if (!parse_pnext_chain(stage["pNext"], &info.stage.pNext))
			return false;

	auto module = string_to_uint64(stage["module"].GetString());
	if (module > 0 && resolve_shader_modules)
	{
		auto module_iter = replayed_shader_modules.find(module);
		if (module_iter == replayed_shader_modules.end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_shader_modules();
			module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				log_missing_resource("Shader module", module);
				return false;
			}
		}
		else
			iface.sync_shader_modules();
		info.stage.module = module_iter->second;
	}
	else
		info.stage.module = api_object_cast<VkShaderModule>(module);

	info.stage.pName = duplicate_string(stage["name"].GetString(), stage["name"].GetStringLength());
	if (stage.HasMember("specializationInfo"))
		if (!parse_specialization_info(stage["specializationInfo"], &info.stage.pSpecializationInfo))
			return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext))
			return false;

	if (!iface.enqueue_create_compute_pipeline(hash, &info, &replayed_compute_pipelines[hash]))
		return false;

	return true;
}